

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O0

void Hacl_Impl_BignumQ_Mul_barrett_reduction_(uint64_t *z,uint64_t *t)

{
  uint64_t *tmp1;
  uint64_t *mu1;
  uint64_t *m1;
  uint64_t tmp [40];
  undefined1 local_158 [136];
  uint64_t *in_stack_ffffffffffffff30;
  uint64_t *in_stack_ffffffffffffff38;
  uint64_t *in_stack_ffffffffffffff40;
  uint64_t *in_stack_ffffffffffffff48;
  uint64_t *in_stack_ffffffffffffff50;
  
  memset(local_158,0,0x140);
  Hacl_Impl_BignumQ_Mul_make_m((uint64_t *)0x10b6d8);
  Hacl_Impl_BignumQ_Mul_make_mu((uint64_t *)0x10b6e2);
  Hacl_Impl_BignumQ_Mul_barrett_reduction__
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  return;
}

Assistant:

static void Hacl_Impl_BignumQ_Mul_barrett_reduction_(uint64_t *z, uint64_t *t)
{
  uint64_t tmp[40U] = { 0U };
  uint64_t *m1 = tmp;
  uint64_t *mu1 = tmp + (uint32_t)5U;
  uint64_t *tmp1 = tmp + (uint32_t)10U;
  Hacl_Impl_BignumQ_Mul_make_m(m1);
  Hacl_Impl_BignumQ_Mul_make_mu(mu1);
  Hacl_Impl_BignumQ_Mul_barrett_reduction__(z, t, m1, mu1, tmp1);
}